

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrule.cpp
# Opt level: O0

bool __thiscall QMimeMagicRule::matchNumber<unsigned_char>(QMimeMagicRule *this,QByteArray *data)

{
  undefined4 uVar1;
  byte bVar2;
  char *pcVar3;
  qsizetype qVar4;
  Promoted<long_long,_int> PVar5;
  QByteArray *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  char *e;
  char *p;
  uchar mask;
  uchar value;
  size_t size;
  uchar dest;
  byte *local_50;
  bool local_29;
  long local_18;
  byte local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(undefined4 *)(in_RDI + 0x70);
  bVar2 = (byte)*(undefined4 *)(in_RDI + 0x74);
  pcVar3 = QByteArray::constData((QByteArray *)0x8f4fd2);
  local_50 = (byte *)(pcVar3 + *(int *)(in_RDI + 0x38));
  pcVar3 = QByteArray::constData((QByteArray *)0x8f4fed);
  qVar4 = QByteArray::size(in_RSI);
  local_18 = qVar4 + -1;
  PVar5 = qMin<long_long,int>(&local_18,(int *)(in_RDI + 0x3c));
  do {
    if (pcVar3 + PVar5 < local_50) {
      local_29 = false;
LAB_008f5091:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_29;
      }
      __stack_chk_fail();
    }
    local_9 = *local_50;
    if ((local_9 & bVar2) == ((byte)uVar1 & bVar2)) {
      local_29 = true;
      goto LAB_008f5091;
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

bool QMimeMagicRule::matchNumber(const QByteArray &data) const
{
    const T value(m_number);
    const T mask(m_numberMask);

    //qDebug() << "matchNumber" << "0x" << QString::number(m_number, 16) << "size" << sizeof(T);
    //qDebug() << "mask" << QString::number(m_numberMask, 16);

    const char *p = data.constData() + m_startPos;
    const char *e = data.constData() + qMin(data.size() - int(sizeof(T)), m_endPos);
    for ( ; p <= e; ++p) {
        if ((qFromUnaligned<T>(p) & mask) == (value & mask))
            return true;
    }

    return false;
}